

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool __thiscall
ON_wString::Equal(ON_wString *this,wchar_t *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int element_count1;
  wchar_t *string1;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  wchar_t *other_string_local;
  ON_wString *this_local;
  
  string1 = operator_cast_to_wchar_t_(this);
  element_count1 = Length(this);
  bVar1 = Equal(string1,element_count1,other_string,-1,locale,bIgnoreCase);
  return bVar1;
}

Assistant:

bool ON_wString::Equal(
  const wchar_t* other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_wString::Equal(
    static_cast< const wchar_t* >(*this),
    this->Length(),
    other_string,
    -1,
    locale,
    bIgnoreCase
    );
}